

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O3

void __thiscall
slang::ast::
ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>
           *this,ConditionBinsSelectExpr *t)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  if (((t->super_BinsSelectExpr).kind != Invalid) &&
     (sVar1 = (t->intersects)._M_extent._M_extent_value, sVar1 != 0)) {
    ppEVar2 = (t->intersects)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::
      visitExpression<slang::ast::Expression_const,always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
                (this_00,this_00,(AlwaysFFVisitor *)this);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

bool bad() const { return kind == BinsSelectExprKind::Invalid; }